

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeMemoryContents
          (ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  Type *this_00;
  char **__return_storage_ptr__;
  pointer puVar1;
  __uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> _Var2;
  uintptr_t uVar3;
  long lVar4;
  Type TVar5;
  Name NVar6;
  Flow local_188;
  Flow local_140;
  undefined1 local_f8 [8];
  DataDrop drop;
  MemoryInit init;
  Const size;
  Const zero;
  
  initializeMemorySizes(this);
  lVar4 = (long)(this->wasm->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->wasm->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    TVar5.id = lVar4 + (ulong)(lVar4 == 0);
    uVar3 = 0;
    __return_storage_ptr__ = &drop.segment.super_IString.str._M_str;
    zero.value.type.id = TVar5.id;
    do {
      puVar1 = (this->wasm->dataSegments).
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var2._M_t.
      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
      super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
           puVar1[uVar3]._M_t.
           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t;
      if (*(char *)((long)_Var2._M_t.
                          super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                          .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x28) ==
          '\0') {
        NVar6.super_IString.str._M_str =
             *(char **)((long)_Var2._M_t.
                              super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                              .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x18
                       );
        NVar6.super_IString.str._M_len = (size_t)this->wasm;
        lVar4 = wasm::Module::getMemory(NVar6);
        size.value.type.id._0_1_ = 0xe;
        zero.value.field_0.i64 = 0;
        zero.value.field_0.func.super_IString.str._M_str = (char *)0x0;
        zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
        zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
        zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
        Literal::makeFromInt32
                  ((Literal *)__return_storage_ptr__,0,(Type)*(uintptr_t *)(lVar4 + 0x50));
        wasm::Literal::operator=
                  ((Literal *)
                   &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
                   (Literal *)__return_storage_ptr__);
        wasm::Literal::~Literal((Literal *)__return_storage_ptr__);
        wasm::Const::finalize();
        init.memory.super_IString.str._M_str._0_1_ = 0xe;
        size.value.field_0.i64 = 0;
        size.value.field_0.func.super_IString.str._M_str = (char *)0x0;
        size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
        size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
        size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
        _Var2._M_t.
        super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
        super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
             puVar1[uVar3]._M_t.
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t;
        Literal::makeFromInt32
                  ((Literal *)__return_storage_ptr__,
                   *(int *)((long)_Var2._M_t.
                                  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                  .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl +
                           0x40) -
                   *(int *)((long)_Var2._M_t.
                                  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                  .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl +
                           0x38),(Type)*(uintptr_t *)(lVar4 + 0x50));
        this_00 = &size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type;
        wasm::Literal::operator=((Literal *)this_00,(Literal *)__return_storage_ptr__);
        wasm::Literal::~Literal((Literal *)__return_storage_ptr__);
        wasm::Const::finalize();
        drop.segment.super_IString.str._M_str._0_1_ = 0x24;
        init.super_SpecificExpression<(wasm::Expression::Id)36>.super_Expression._id = InvalidId;
        init.super_SpecificExpression<(wasm::Expression::Id)36>.super_Expression._1_7_ = 0;
        _Var2._M_t.
        super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
        super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
             puVar1[uVar3]._M_t.
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t;
        init.size = *(Expression **)
                     ((long)_Var2._M_t.
                            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                            .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x18);
        init.memory.super_IString.str._M_len =
             *(size_t *)
              ((long)_Var2._M_t.
                     super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                     .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x20);
        _Var2._M_t.
        super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
        super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
             puVar1[uVar3]._M_t.
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t;
        init.super_SpecificExpression<(wasm::Expression::Id)36>.super_Expression.type.id =
             *(uintptr_t *)
              _Var2._M_t.
              super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
              super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        init.segment.super_IString.str._M_len =
             *(size_t *)
              ((long)_Var2._M_t.
                     super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                     .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 8);
        init.segment.super_IString.str._M_str =
             *(char **)((long)puVar1[uVar3]._M_t.
                              super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                              ._M_t + 0x30);
        init.dest = (Expression *)&size.value.type;
        init.offset = (Expression *)&init.memory.super_IString.str._M_str;
        wasm::MemoryInit::finalize();
        local_f8[0] = DataDropId;
        drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._id = InvalidId;
        drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._1_7_ = 0;
        _Var2._M_t.
        super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
        super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
             puVar1[uVar3]._M_t.
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t;
        drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression.type.id =
             *(uintptr_t *)
              _Var2._M_t.
              super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
              super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        drop.segment.super_IString.str._M_len =
             *(size_t *)
              ((long)_Var2._M_t.
                     super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                     .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 8);
        wasm::DataDrop::finalize();
        ExpressionRunner<wasm::ModuleRunner>::visit
                  (&local_188,&this->super_ExpressionRunner<wasm::ModuleRunner>,
                   (Expression *)__return_storage_ptr__);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&local_188.values.super_SmallVector<wasm::Literal,_1UL>.flexible);
        wasm::Literal::~Literal
                  (local_188.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
        ExpressionRunner<wasm::ModuleRunner>::visit
                  (&local_140,&this->super_ExpressionRunner<wasm::ModuleRunner>,
                   (Expression *)local_f8);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&local_140.values.super_SmallVector<wasm::Literal,_1UL>.flexible);
        wasm::Literal::~Literal
                  (local_140.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
        wasm::Literal::~Literal((Literal *)this_00);
        wasm::Literal::~Literal
                  ((Literal *)
                   &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type);
        TVar5 = zero.value.type;
      }
      uVar3 = uVar3 + 1;
    } while (TVar5.id != uVar3);
  }
  return;
}

Assistant:

void initializeMemoryContents() {
    initializeMemorySizes();

    // apply active memory segments
    for (size_t i = 0, e = wasm.dataSegments.size(); i < e; ++i) {
      auto& segment = wasm.dataSegments[i];
      if (segment->isPassive) {
        continue;
      }

      auto* memory = wasm.getMemory(segment->memory);

      Const zero;
      zero.value = Literal::makeFromInt32(0, memory->addressType);
      zero.finalize();

      Const size;
      size.value =
        Literal::makeFromInt32(segment->data.size(), memory->addressType);
      size.finalize();

      MemoryInit init;
      init.memory = segment->memory;
      init.segment = segment->name;
      init.dest = segment->offset;
      init.offset = &zero;
      init.size = &size;
      init.finalize();

      DataDrop drop;
      drop.segment = segment->name;
      drop.finalize();

      self()->visit(&init);
      self()->visit(&drop);
    }
  }